

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall Engine::dispose(Engine *this)

{
  ScriptBlock *this_00;
  Variable **ppVVar1;
  Variable *this_01;
  string *psVar2;
  IGlobalFunction **ppIVar3;
  long lVar4;
  ulong uVar5;
  
  this_00 = this->currentScript;
  if (this_00 != (ScriptBlock *)0x0) {
    ScriptBlock::~ScriptBlock(this_00);
  }
  operator_delete(this_00);
  for (uVar5 = 0; ppVVar1 = this->variables, uVar5 < this->variablesCount; uVar5 = uVar5 + 1) {
    this_01 = ppVVar1[uVar5];
    if (this_01 != (Variable *)0x0) {
      Variable::~Variable(this_01);
    }
    operator_delete(this_01);
  }
  if (ppVVar1 != (Variable **)0x0) {
    operator_delete__(ppVVar1);
  }
  psVar2 = this->variableNames;
  if (psVar2 != (string *)0x0) {
    lVar4 = *(long *)((long)&psVar2[-1].field_2 + 8);
    if (lVar4 != 0) {
      lVar4 = lVar4 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&psVar2[-1]._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__((void *)((long)&psVar2[-1].field_2 + 8));
  }
  for (uVar5 = 0; ppIVar3 = this->globalFunctions, uVar5 < this->globalFunctionsCount;
      uVar5 = uVar5 + 1) {
    operator_delete(ppIVar3[uVar5]);
  }
  if (ppIVar3 != (IGlobalFunction **)0x0) {
    operator_delete__(ppIVar3);
  }
  psVar2 = this->globalFunctionNames;
  if (psVar2 != (string *)0x0) {
    lVar4 = *(long *)((long)&psVar2[-1].field_2 + 8);
    if (lVar4 != 0) {
      lVar4 = lVar4 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&psVar2[-1]._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__((void *)((long)&psVar2[-1].field_2 + 8));
  }
  if (this->localFunctions != (LocalFunction **)0x0) {
    operator_delete__(this->localFunctions);
  }
  psVar2 = this->localFunctionNames;
  if (psVar2 != (string *)0x0) {
    lVar4 = *(long *)((long)&psVar2[-1].field_2 + 8);
    if (lVar4 != 0) {
      lVar4 = lVar4 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&psVar2[-1]._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__((void *)((long)&psVar2[-1].field_2 + 8));
    return;
  }
  return;
}

Assistant:

void Engine::dispose() {
	//Script also deletes local functions
	delete this->currentScript;
	
	unsigned int i;
	for (i = 0; i < this->variablesCount; i++) {
		delete this->variables[i];
		//delete this->variableNames[i];
	}
	delete[] this->variables;
	delete[] this->variableNames;
	
	for (i = 0; i < this->globalFunctionsCount; i++) {
		delete this->globalFunctions[i];
		//delete this->globalFunctionNames[i];
	}
	delete[] this->globalFunctions;
	delete[] this->globalFunctionNames;
	
	/*for (i = 0; i < this->localFunctionsCount; i++) {
		delete this->localFunctionNames[i];
	}*/
	delete[] this->localFunctions;
	delete[] this->localFunctionNames;
}